

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmilankoviccalendar.cpp
# Opt level: O0

bool __thiscall QMilankovicCalendar::isLeapYear(QMilankovicCalendar *this,int year)

{
  long lVar1;
  int iVar2;
  R_conflict16 RVar3;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  qint16 century;
  R_conflict16 yeardm;
  int local_24;
  int a;
  bool local_11;
  int iStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == -0x80000000) {
    local_11 = false;
  }
  else {
    local_24 = in_ESI;
    if (in_ESI < 1) {
      local_24 = in_ESI + 1;
    }
    a = (int)((ulong)in_RDI >> 0x20);
    iVar2 = QRoundingDown::qMod<4u,int>(a);
    if (iVar2 == 0) {
      RVar3 = QRoundingDown::qDivMod<100U,_int,_true>(local_24);
      iStack_c = RVar3.remainder;
      if (iStack_c == 0) {
        iVar2 = QRoundingDown::qMod<9u,int>(a);
        if (((short)iVar2 != 2) && ((short)iVar2 != 6)) {
          local_11 = false;
          goto LAB_0057e3b8;
        }
      }
      local_11 = true;
    }
    else {
      local_11 = false;
    }
  }
LAB_0057e3b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool QMilankovicCalendar::isLeapYear(int year) const
{
    if (year == QCalendar::Unspecified)
        return false;
    if (year <= 0)
        ++year;
    if (qMod<4>(year))
        return false;
    const auto yeardm = qDivMod<100>(year);
    if (yeardm.remainder == 0) {
        const qint16 century = qMod<9>(yeardm.quotient);
        if (century != 2 && century != 6)
            return false;
    }
    return true;
}